

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O0

void __thiscall
EmitNoXml::tagLabel(EmitNoXml *this,char *ptr,syntax_highlight hl,AddrSpace *spc,uintb off)

{
  uintb off_local;
  AddrSpace *spc_local;
  syntax_highlight hl_local;
  char *ptr_local;
  EmitNoXml *this_local;
  
  std::operator<<((this->super_EmitXml).s,ptr);
  return;
}

Assistant:

virtual void tagLabel(const char *ptr,syntax_highlight hl,
			 const AddrSpace *spc,uintb off) {
    *s << ptr; }